

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O3

QRgba64 * qt_fetch_conical_gradient_rgb64
                    (QRgba64 *buffer,Operator *param_2,QSpanData *data,int y,int x,int length)

{
  Type TVar1;
  QRgba64 *b;
  QRgba64 *pQVar2;
  QRgba64 *pQVar3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  dVar5 = (double)y + 0.5;
  dVar9 = (double)x + 0.5;
  dVar6 = dVar9 * data->m11 + dVar5 * data->m21 + data->dx;
  dVar7 = dVar9 * data->m12 + dVar5 * data->m22 + data->dy;
  dVar8 = data->m13;
  if ((dVar8 != 0.0) || (NAN(dVar8))) {
    pQVar2 = buffer + length;
  }
  else {
    pQVar2 = buffer + length;
    if ((data->m23 == 0.0) && (!NAN(data->m23))) {
      if (length < 1) {
        return buffer;
      }
      dVar6 = dVar6 - *(double *)((long)&data->field_23 + 8);
      dVar7 = dVar7 - *(double *)((long)&data->field_23 + 0x10);
      pQVar3 = buffer;
      do {
        dVar8 = atan2(dVar7,dVar6);
        TVar1 = GradientBase64::fetchSingle
                          (&(data->field_23).gradient,
                           (dVar8 + *(double *)((long)&data->field_23 + 0x18)) *
                           -0.15915494309189535 + 1.0);
        pQVar3->rgba = TVar1.rgba;
        dVar6 = dVar6 + data->m11;
        dVar7 = dVar7 + data->m12;
        pQVar3 = pQVar3 + 1;
      } while (pQVar3 < pQVar2);
      return buffer;
    }
  }
  if (buffer < pQVar2) {
    dVar8 = dVar8 * dVar9 + dVar5 * data->m23 + data->m33;
    uVar4 = -(ulong)(dVar8 != 0.0);
    dVar8 = (double)(~uVar4 & 0x3ff0000000000000 | (ulong)dVar8 & uVar4);
    pQVar3 = buffer;
    do {
      dVar5 = atan2(dVar7 / dVar8 - *(double *)((long)&data->field_23 + 8),
                    dVar6 / dVar8 - *(double *)((long)&data->field_23 + 0x10));
      TVar1 = GradientBase64::fetchSingle
                        (&(data->field_23).gradient,
                         (dVar5 + *(double *)((long)&data->field_23 + 0x18)) * -0.15915494309189535
                         + 1.0);
      pQVar3->rgba = TVar1.rgba;
      dVar6 = dVar6 + data->m11;
      dVar7 = dVar7 + data->m12;
      dVar8 = dVar8 + data->m13;
      dVar8 = (double)((ulong)dVar8 & -(ulong)(dVar8 != 0.0) |
                      ~-(ulong)(dVar8 != 0.0) & (ulong)(data->m13 + dVar8));
      pQVar3 = pQVar3 + 1;
    } while (pQVar3 < pQVar2);
  }
  return buffer;
}

Assistant:

static const QRgba64 * QT_FASTCALL qt_fetch_conical_gradient_rgb64(QRgba64 *buffer, const Operator *, const QSpanData *data,
                                                                   int y, int x, int length)
{
    return qt_fetch_conical_gradient_template<GradientBase64, QRgba64>(buffer, data, y, x, length);
}